

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Fraig(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  Abc_Frame_t *pAbc_00;
  int iVar3;
  uint uVar4;
  Gia_Man_t *pGVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  Cec_ParFra_t ParsFra;
  Cec_ParFra_t local_80;
  Abc_Frame_t *local_38;
  
  local_38 = pAbc;
  Cec_ManFraSetDefaultParams(&local_80);
  local_80.fSatSweeping = 1;
  local_80.nItersMax = 1000000;
  bVar1 = false;
  Extra_UtilGetoptReset();
  bVar2 = false;
LAB_002812a2:
  do {
    iVar3 = Extra_UtilGetopt(argc,argv,"WRILDCrmdckngwvh");
    pAbc_00 = local_38;
    iVar8 = globalUtilOptind;
    if (iVar3 < 0x57) {
      switch(iVar3) {
      case 0x43:
        if (argc <= globalUtilOptind) {
          pcVar6 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_00281468:
          Abc_Print(-1,pcVar6);
          goto switchD_002812c8_caseD_65;
        }
        uVar4 = atoi(argv[globalUtilOptind]);
        local_80.nBTLimit = uVar4;
        break;
      case 0x44:
        if (argc <= globalUtilOptind) {
          pcVar6 = "Command line switch \"-D\" should be followed by an integer.\n";
          goto LAB_00281468;
        }
        uVar4 = atoi(argv[globalUtilOptind]);
        local_80.nDepthMax = uVar4;
        break;
      case 0x45:
      case 0x46:
      case 0x47:
      case 0x48:
      case 0x4a:
      case 0x4b:
        goto switchD_002812c8_caseD_65;
      case 0x49:
        if (argc <= globalUtilOptind) {
          pcVar6 = "Command line switch \"-I\" should be followed by an integer.\n";
          goto LAB_00281468;
        }
        uVar4 = atoi(argv[globalUtilOptind]);
        local_80.nItersMax = uVar4;
        break;
      case 0x4c:
        if (argc <= globalUtilOptind) {
          pcVar6 = "Command line switch \"-L\" should be followed by an integer.\n";
          goto LAB_00281468;
        }
        uVar4 = atoi(argv[globalUtilOptind]);
        local_80.nLevelMax = uVar4;
        break;
      default:
        if (iVar3 != 0x52) {
          if (iVar3 == -1) {
            pGVar5 = local_38->pGia;
            if (pGVar5 != (Gia_Man_t *)0x0) {
              if (bVar1) {
                pGVar5 = Cec2_ManSimulateTest(pGVar5,&local_80);
              }
              else if (bVar2) {
                pGVar5 = Cec3_ManSimulateTest(pGVar5,&local_80);
              }
              else {
                pGVar5 = Cec_ManSatSweeping(pGVar5,&local_80,0);
              }
              Abc_FrameUpdateGia(pAbc_00,pGVar5);
              return 0;
            }
            pcVar6 = "Abc_CommandAbc9Fraig(): There is no AIG.\n";
            iVar8 = -1;
            goto LAB_0028165f;
          }
          goto switchD_002812c8_caseD_65;
        }
        if (argc <= globalUtilOptind) {
          pcVar6 = "Command line switch \"-R\" should be followed by an integer.\n";
          goto LAB_00281468;
        }
        uVar4 = atoi(argv[globalUtilOptind]);
        local_80.nRounds = uVar4;
      }
    }
    else {
      switch(iVar3) {
      case 99:
        local_80.fRunCSat = local_80.fRunCSat ^ 1;
        goto LAB_002812a2;
      case 100:
        local_80.fDualOut = local_80.fDualOut ^ 1;
        goto LAB_002812a2;
      case 0x65:
      case 0x66:
      case 0x68:
      case 0x69:
      case 0x6a:
      case 0x6c:
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
      case 0x74:
      case 0x75:
        goto switchD_002812c8_caseD_65;
      case 0x67:
        bVar2 = (bool)(bVar2 ^ 1);
        goto LAB_002812a2;
      case 0x6b:
        local_80.fUseCones = local_80.fUseCones ^ 1;
        goto LAB_002812a2;
      case 0x6d:
        local_80.fCheckMiter = local_80.fCheckMiter ^ 1;
        goto LAB_002812a2;
      case 0x6e:
        bVar1 = (bool)(bVar1 ^ 1);
        goto LAB_002812a2;
      case 0x72:
        local_80.fRewriting = local_80.fRewriting ^ 1;
        goto LAB_002812a2;
      case 0x76:
        local_80.fVerbose = local_80.fVerbose ^ 1;
        goto LAB_002812a2;
      case 0x77:
        local_80.fVeryVerbose = local_80.fVeryVerbose ^ 1;
        goto LAB_002812a2;
      default:
        if (iVar3 != 0x57) goto switchD_002812c8_caseD_65;
        if (argc <= globalUtilOptind) {
          pcVar6 = "Command line switch \"-W\" should be followed by an integer.\n";
          goto LAB_00281468;
        }
        uVar4 = atoi(argv[globalUtilOptind]);
        local_80.nWords = uVar4;
      }
    }
    globalUtilOptind = iVar8 + 1;
    if ((int)uVar4 < 0) {
switchD_002812c8_caseD_65:
      Abc_Print(-2,"usage: &fraig [-WRILDC <num>] [-rmdckngwvh]\n");
      Abc_Print(-2,"\t         performs combinational SAT sweeping\n");
      Abc_Print(-2,"\t-W num : the number of simulation words [default = %d]\n",
                (ulong)(uint)local_80.nWords);
      Abc_Print(-2,"\t-R num : the number of simulation rounds [default = %d]\n",
                (ulong)(uint)local_80.nRounds);
      Abc_Print(-2,"\t-I num : the number of sweeping iterations [default = %d]\n",
                (ulong)(uint)local_80.nItersMax);
      Abc_Print(-2,"\t-L num : the max number of levels of nodes to consider [default = %d]\n",
                (ulong)(uint)local_80.nLevelMax);
      Abc_Print(-2,"\t-D num : the max number of steps of speculative reduction [default = %d]\n",
                (ulong)(uint)local_80.nDepthMax);
      Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
                (ulong)(uint)local_80.nBTLimit);
      pcVar7 = "yes";
      pcVar6 = "yes";
      if (local_80.fRewriting == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-r     : toggle the use of AIG rewriting [default = %s]\n",pcVar6);
      pcVar6 = "miter";
      if (local_80.fCheckMiter == 0) {
        pcVar6 = "circuit";
      }
      Abc_Print(-2,"\t-m     : toggle miter vs. any circuit [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (local_80.fDualOut == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-d     : toggle using double output miters [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (local_80.fRunCSat == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-c     : toggle using circuit-based solver [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (local_80.fUseCones == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-k     : toggle using logic cones in the SAT solver [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (!bVar1) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-n     : toggle using new implementation [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (!bVar2) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-g     : toggle using another new implementation [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (local_80.fVeryVerbose == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-w     : toggle printing even more verbose information [default = %s]\n",
                pcVar6);
      if (local_80.fVerbose == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar7);
      pcVar6 = "\t-h     : print the command usage\n";
      iVar8 = -2;
LAB_0028165f:
      Abc_Print(iVar8,pcVar6);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Fraig( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Cec2_ManSimulateTest( Gia_Man_t * p, Cec_ParFra_t * pPars );
    extern Gia_Man_t * Cec3_ManSimulateTest( Gia_Man_t * p, Cec_ParFra_t * pPars );
    Cec_ParFra_t ParsFra, * pPars = &ParsFra;
    Gia_Man_t * pTemp;
    int c, fUseAlgo = 0, fUseAlgoG = 0;
    Cec_ManFraSetDefaultParams( pPars );
    pPars->fSatSweeping = 1;
    pPars->nItersMax = 1000000;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "WRILDCrmdckngwvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWords < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRounds = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRounds < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nItersMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nItersMax < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLevelMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLevelMax < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nDepthMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nDepthMax < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'r':
            pPars->fRewriting ^= 1;
            break;
        case 'm':
            pPars->fCheckMiter ^= 1;
            break;
        case 'd':
            pPars->fDualOut ^= 1;
            break;
        case 'c':
            pPars->fRunCSat ^= 1;
            break;
        case 'k':
            pPars->fUseCones ^= 1;
            break;
        case 'n':
            fUseAlgo ^= 1;
            break;
        case 'g':
            fUseAlgoG ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Fraig(): There is no AIG.\n" );
        return 1;
    }
    if ( fUseAlgo )
        pTemp = Cec2_ManSimulateTest( pAbc->pGia, pPars );
    else if ( fUseAlgoG )
        pTemp = Cec3_ManSimulateTest( pAbc->pGia, pPars );
    else
        pTemp = Cec_ManSatSweeping( pAbc->pGia, pPars, 0 );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &fraig [-WRILDC <num>] [-rmdckngwvh]\n" );
    Abc_Print( -2, "\t         performs combinational SAT sweeping\n" );
    Abc_Print( -2, "\t-W num : the number of simulation words [default = %d]\n", pPars->nWords );
    Abc_Print( -2, "\t-R num : the number of simulation rounds [default = %d]\n", pPars->nRounds );
    Abc_Print( -2, "\t-I num : the number of sweeping iterations [default = %d]\n", pPars->nItersMax );
    Abc_Print( -2, "\t-L num : the max number of levels of nodes to consider [default = %d]\n", pPars->nLevelMax );
    Abc_Print( -2, "\t-D num : the max number of steps of speculative reduction [default = %d]\n", pPars->nDepthMax );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-r     : toggle the use of AIG rewriting [default = %s]\n", pPars->fRewriting? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle miter vs. any circuit [default = %s]\n", pPars->fCheckMiter? "miter": "circuit" );
    Abc_Print( -2, "\t-d     : toggle using double output miters [default = %s]\n", pPars->fDualOut? "yes": "no" );
    Abc_Print( -2, "\t-c     : toggle using circuit-based solver [default = %s]\n", pPars->fRunCSat? "yes": "no" );
    Abc_Print( -2, "\t-k     : toggle using logic cones in the SAT solver [default = %s]\n", pPars->fUseCones? "yes": "no" );
    Abc_Print( -2, "\t-n     : toggle using new implementation [default = %s]\n", fUseAlgo? "yes": "no" );
    Abc_Print( -2, "\t-g     : toggle using another new implementation [default = %s]\n", fUseAlgoG? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printing even more verbose information [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}